

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O2

int32_t icu_63::CollationFastLatin::compareUTF16
                  (uint16_t *table,uint16_t *primaries,int32_t options,UChar *left,
                  int32_t leftLength,UChar *right,int32_t rightLength)

{
  uint16_t *table_00;
  UChar UVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  uint16_t *puVar8;
  uint uVar9;
  uint variableTop;
  uint32_t uVar10;
  bool bVar11;
  bool bVar12;
  int32_t rightIndex;
  int32_t leftIndex;
  int32_t leftLength_local;
  ulong local_58;
  uint local_4c;
  uint16_t *local_48;
  UChar *local_40;
  uint local_34;
  
  table_00 = table + (byte)*table;
  leftIndex = 0;
  rightIndex = 0;
  variableTop = (uint)options >> 0x10;
  local_34 = options & 0xffff;
  local_48 = table + ((ulong)(byte)*table - 0x1e80);
  uVar10 = 0;
  local_58 = 0xfffffffffffffffe;
  uVar3 = 0;
  leftLength_local = leftLength;
  local_4c = options;
  local_40 = right;
LAB_002344f2:
  do {
    if (uVar3 == 0) {
      lVar6 = (long)leftIndex;
      if (leftIndex == leftLength_local) {
        uVar3 = 2;
      }
      else {
        leftIndex = leftIndex + 1;
        UVar1 = left[lVar6];
        uVar7 = (ulong)(ushort)UVar1;
        if ((ushort)UVar1 < 0x180) {
          uVar3 = (uint)primaries[uVar7];
          if (primaries[uVar7] == 0) {
            puVar8 = table_00;
            if (((local_4c & 2) != 0) && (0xfff5 < (ushort)(UVar1 + L'ￆ'))) goto LAB_00234d57;
LAB_00234565:
            uVar5 = (uint)puVar8[uVar7];
LAB_00234568:
            uVar3 = uVar5;
            if (uVar5 < 0x1000) goto LAB_00234572;
            uVar3 = uVar5 & 0xfc00;
          }
        }
        else {
          puVar8 = local_48;
          if (((UVar1 & 0xffc0U) == 0x2000) || (((ushort)UVar1 & 0xffffffc0) == 0x2000))
          goto LAB_00234565;
          uVar5 = 1;
          if (uVar7 == 0xffff) {
            uVar5 = 0xfca8;
          }
          uVar3 = 3;
          if (uVar7 != 0xfffe) goto LAB_00234568;
LAB_00234572:
          if (uVar3 <= variableTop) {
            uVar2 = nextPair(table_00,(uint)(ushort)UVar1,uVar3,left,(uint8_t *)0x0,&leftIndex,
                             &leftLength_local);
            if (uVar2 == 1) goto LAB_00234d57;
            uVar3 = getPrimaries(variableTop,uVar2);
            goto LAB_002344f2;
          }
          uVar3 = uVar3 & 0xff8;
        }
      }
    }
    for (; uVar10 == 0; uVar10 = getPrimaries(variableTop,uVar10)) {
      lVar6 = (long)rightIndex;
      if (rightIndex == rightLength) {
        uVar10 = 2;
        break;
      }
      rightIndex = rightIndex + 1;
      UVar1 = local_40[lVar6];
      uVar7 = (ulong)(ushort)UVar1;
      if ((ushort)UVar1 < 0x180) {
        uVar10 = (uint32_t)primaries[uVar7];
        if (primaries[uVar7] != 0) break;
        puVar8 = table_00;
        if (((local_4c & 2) != 0) && (0xfff5 < (ushort)(UVar1 + L'ￆ'))) goto LAB_00234d57;
LAB_0023465c:
        uVar5 = (uint)puVar8[uVar7];
LAB_00234660:
        uVar9 = uVar5;
        if (0xfff < uVar5) {
          uVar10 = uVar5 & 0xfc00;
          break;
        }
      }
      else {
        puVar8 = local_48;
        if (((UVar1 & 0xffc0U) == 0x2000) || (((ushort)UVar1 & 0xffffffc0) == 0x2000))
        goto LAB_0023465c;
        uVar5 = 1;
        if (uVar7 == 0xffff) {
          uVar5 = 0xfca8;
        }
        uVar9 = 3;
        if (uVar7 != 0xfffe) goto LAB_00234660;
      }
      if (variableTop < uVar9) {
        uVar10 = uVar9 & 0xff8;
        break;
      }
      uVar10 = nextPair(table_00,(uint)(ushort)UVar1,uVar9,local_40,(uint8_t *)0x0,&rightIndex,
                        &rightLength);
      if (uVar10 == 1) goto LAB_00234d57;
    }
    if (uVar3 != uVar10) {
      uVar5 = uVar3 & 0xffff;
      uVar9 = uVar10 & 0xffff;
      if (uVar5 != uVar9) goto LAB_00234d49;
      if (uVar3 == 2) break;
      uVar3 = uVar3 >> 0x10;
      uVar10 = uVar10 >> 0x10;
      goto LAB_002344f2;
    }
    uVar10 = 0;
    bVar11 = uVar3 != 2;
    uVar3 = 0;
  } while (bVar11);
  if (0xfff < local_34) {
    rightIndex = 0;
    leftIndex = 0;
    uVar3 = 0;
    uVar10 = 0;
LAB_00234934:
    do {
      uVar4 = uVar10;
      if (uVar10 == 0) {
        lVar6 = (long)leftIndex;
        if (leftIndex == leftLength_local) {
          uVar4 = 2;
        }
        else {
          leftIndex = leftIndex + 1;
          UVar1 = left[lVar6];
          uVar5 = (uint)(ushort)UVar1;
          puVar8 = table_00;
          if (((ushort)UVar1 < 0x180) || (puVar8 = local_48, (UVar1 & 0xffc0U) == 0x2000)) {
            uVar9 = (uint)puVar8[uVar5];
LAB_00234986:
            uVar4 = uVar9;
            if (0xfff < uVar9) {
              uVar9 = uVar9 & 0x3e0;
              uVar4 = uVar9 * 0x10000 + 0x2000c0;
              if (uVar9 < 0x180) {
                uVar4 = uVar9 + 0x20;
              }
              goto LAB_00234a09;
            }
          }
          else {
            uVar9 = 1;
            if (uVar5 == 0xffff) {
              uVar9 = 0xfca8;
            }
            uVar4 = 3;
            if (uVar5 != 0xfffe) goto LAB_00234986;
          }
          if (uVar4 <= variableTop) {
            uVar10 = nextPair(table_00,uVar5,uVar4,left,(uint8_t *)0x0,&leftIndex,&leftLength_local)
            ;
            uVar10 = getSecondaries(variableTop,uVar10);
            goto LAB_00234934;
          }
          uVar4 = 0xc0;
        }
      }
LAB_00234a09:
      while (uVar3 == 0) {
        lVar6 = (long)rightIndex;
        if (rightIndex == rightLength) {
          uVar3 = 2;
          break;
        }
        rightIndex = rightIndex + 1;
        UVar1 = local_40[lVar6];
        uVar3 = (uint)(ushort)UVar1;
        puVar8 = table_00;
        if (((ushort)UVar1 < 0x180) || (puVar8 = local_48, (UVar1 & 0xffc0U) == 0x2000)) {
          uVar5 = (uint)puVar8[uVar3];
LAB_00234a61:
          uVar9 = uVar5;
          if (0xfff < uVar5) {
            uVar5 = uVar5 & 0x3e0;
            uVar3 = uVar5 * 0x10000 + 0x2000c0;
            if (uVar5 < 0x180) {
              uVar3 = uVar5 + 0x20;
            }
            break;
          }
        }
        else {
          uVar5 = 1;
          if (uVar3 == 0xffff) {
            uVar5 = 0xfca8;
          }
          uVar9 = 3;
          if (uVar3 != 0xfffe) goto LAB_00234a61;
        }
        if (variableTop < uVar9) {
          uVar3 = 0xc0;
          break;
        }
        uVar10 = nextPair(table_00,uVar3,uVar9,local_40,(uint8_t *)0x0,&rightIndex,&rightLength);
        uVar3 = getSecondaries(variableTop,uVar10);
      }
      if (uVar4 != uVar3) {
        uVar5 = uVar4 & 0xffff;
        uVar9 = uVar3 & 0xffff;
        if (uVar5 != uVar9) {
          if ((local_4c >> 0xb & 1) == 0) goto LAB_00234d49;
          goto LAB_00234d57;
        }
        if (uVar4 == 2) break;
        uVar10 = uVar4 >> 0x10;
        uVar3 = uVar3 >> 0x10;
        goto LAB_00234934;
      }
      uVar3 = 0;
      uVar10 = 0;
    } while (uVar4 != 2);
  }
  if ((local_4c >> 10 & 1) != 0) {
    bVar11 = local_34 < 0x1000;
    rightIndex = 0;
    leftIndex = 0;
    uVar4 = 0;
    uVar3 = 0;
LAB_00234b55:
    do {
      if (uVar3 == 0) {
        lVar6 = (long)leftIndex;
        if (leftIndex != leftLength_local) {
          leftIndex = leftIndex + 1;
          UVar1 = left[lVar6];
          uVar3 = (uint)(ushort)UVar1;
          puVar8 = table_00;
          if (((ushort)UVar1 < 0x180) || (puVar8 = local_48, (UVar1 & 0xffc0U) == 0x2000)) {
            uVar5 = (uint)puVar8[uVar3];
LAB_00234b9c:
            uVar10 = uVar5;
            if (uVar10 < 0xc00) goto LAB_00234bc4;
          }
          else {
            uVar5 = 1;
            if (uVar3 == 0xffff) {
              uVar5 = 0xfca8;
            }
            uVar10 = 3;
            if (uVar3 != 0xfffe) goto LAB_00234b9c;
LAB_00234bc4:
            uVar10 = nextPair(table_00,uVar3,uVar10,left,(uint8_t *)0x0,&leftIndex,&leftLength_local
                             );
          }
          uVar3 = getCases(variableTop,bVar11,uVar10);
          goto LAB_00234b55;
        }
        uVar3 = 2;
      }
      while (uVar4 == 0) {
        lVar6 = (long)rightIndex;
        if (rightIndex == rightLength) {
          uVar4 = 2;
          break;
        }
        rightIndex = rightIndex + 1;
        UVar1 = local_40[lVar6];
        uVar5 = (uint)(ushort)UVar1;
        puVar8 = table_00;
        if (((ushort)UVar1 < 0x180) || (puVar8 = local_48, (UVar1 & 0xffc0U) == 0x2000)) {
          uVar9 = (uint)puVar8[uVar5];
LAB_00234c47:
          uVar10 = uVar9;
          if (uVar10 < 0xc00) goto LAB_00234c6f;
        }
        else {
          uVar9 = 1;
          if (uVar5 == 0xffff) {
            uVar9 = 0xfca8;
          }
          uVar10 = 3;
          if (uVar5 != 0xfffe) goto LAB_00234c47;
LAB_00234c6f:
          uVar10 = nextPair(table_00,uVar5,uVar10,local_40,(uint8_t *)0x0,&rightIndex,&rightLength);
        }
        uVar4 = getCases(variableTop,bVar11,uVar10);
      }
      if (uVar3 != uVar4) {
        uVar5 = uVar3 & 0xffff;
        uVar9 = uVar4 & 0xffff;
        if (uVar5 != uVar9) {
          if ((local_4c >> 8 & 1) == 0) goto LAB_00234d49;
          uVar3 = (uVar5 < uVar9) - 1;
          goto LAB_00234d4f;
        }
        if (uVar3 == 2) break;
        uVar3 = uVar3 >> 0x10;
        uVar4 = uVar4 >> 0x10;
        goto LAB_00234b55;
      }
      uVar4 = 0;
      bVar12 = uVar3 != 2;
      uVar3 = 0;
    } while (bVar12);
  }
  if (0x1fff < local_34) {
    bVar11 = (local_4c & 0x600) == 0x200;
    rightIndex = 0;
    leftIndex = 0;
    uVar10 = 0;
    uVar3 = 0;
LAB_0023477d:
    do {
      if (uVar3 == 0) {
        lVar6 = (long)leftIndex;
        if (leftIndex != leftLength_local) {
          leftIndex = leftIndex + 1;
          UVar1 = left[lVar6];
          uVar3 = (uint)(ushort)UVar1;
          puVar8 = table_00;
          if (((ushort)UVar1 < 0x180) || (puVar8 = local_48, (UVar1 & 0xffc0U) == 0x2000)) {
            uVar5 = (uint)puVar8[uVar3];
LAB_002347c4:
            uVar2 = uVar5;
            if (uVar2 < 0xc00) goto LAB_002347ec;
          }
          else {
            uVar5 = 1;
            if (uVar3 == 0xffff) {
              uVar5 = 0xfca8;
            }
            uVar2 = 3;
            if (uVar3 != 0xfffe) goto LAB_002347c4;
LAB_002347ec:
            uVar2 = nextPair(table_00,uVar3,uVar2,left,(uint8_t *)0x0,&leftIndex,&leftLength_local);
          }
          uVar3 = getTertiaries(variableTop,bVar11,uVar2);
          goto LAB_0023477d;
        }
        uVar3 = 2;
      }
      for (; uVar10 == 0; uVar10 = getTertiaries(variableTop,bVar11,uVar10)) {
        lVar6 = (long)rightIndex;
        if (rightIndex == rightLength) {
          uVar10 = 2;
          break;
        }
        rightIndex = rightIndex + 1;
        UVar1 = local_40[lVar6];
        uVar5 = (uint)(ushort)UVar1;
        puVar8 = table_00;
        if (((ushort)UVar1 < 0x180) || (puVar8 = local_48, (UVar1 & 0xffc0U) == 0x2000)) {
          uVar9 = (uint)puVar8[uVar5];
LAB_0023486f:
          uVar10 = uVar9;
          if (uVar10 < 0xc00) goto LAB_00234897;
        }
        else {
          uVar9 = 1;
          if (uVar5 == 0xffff) {
            uVar9 = 0xfca8;
          }
          uVar10 = 3;
          if (uVar5 != 0xfffe) goto LAB_0023486f;
LAB_00234897:
          uVar10 = nextPair(table_00,uVar5,uVar10,local_40,(uint8_t *)0x0,&rightIndex,&rightLength);
        }
      }
      if (uVar3 != uVar10) {
        uVar5 = uVar3 & 0xffff;
        uVar9 = uVar10 & 0xffff;
        if (uVar5 != uVar9) {
          if ((local_4c & 0x700) == 0x300) {
            if (3 < uVar5) {
              uVar5 = uVar5 ^ 0x18;
            }
            if (3 < uVar9) {
              uVar9 = uVar9 ^ 0x18;
            }
          }
          goto LAB_00234d49;
        }
        if (uVar3 == 2) break;
        uVar3 = uVar3 >> 0x10;
        uVar10 = uVar10 >> 0x10;
        goto LAB_0023477d;
      }
      uVar10 = 0;
      bVar12 = uVar3 != 2;
      uVar3 = 0;
    } while (bVar12);
    if (0x2fff < local_34) {
      rightIndex = 0;
      leftIndex = 0;
      local_58 = 0;
      uVar3 = 0;
LAB_00234d8a:
      do {
        uVar7 = local_58;
        if (uVar3 == 0) {
          lVar6 = (long)leftIndex;
          if (leftIndex != leftLength_local) {
            leftIndex = leftIndex + 1;
            UVar1 = left[lVar6];
            uVar3 = (uint)(ushort)UVar1;
            puVar8 = table_00;
            if (((ushort)UVar1 < 0x180) || (puVar8 = local_48, (UVar1 & 0xffc0U) == 0x2000)) {
              uVar10 = (uint32_t)puVar8[uVar3];
LAB_00234dd0:
              uVar5 = uVar10;
              if (uVar10 < 0xc00) goto LAB_00234df7;
            }
            else {
              uVar10 = 1;
              if (uVar3 == 0xffff) {
                uVar10 = 0xfca8;
              }
              uVar5 = 3;
              if (uVar3 != 0xfffe) goto LAB_00234dd0;
LAB_00234df7:
              uVar10 = nextPair(table_00,uVar3,uVar5,left,(uint8_t *)0x0,&leftIndex,
                                &leftLength_local);
            }
            uVar3 = getQuaternaries(variableTop,uVar10);
            goto LAB_00234d8a;
          }
          uVar3 = 2;
        }
        while ((int)uVar7 == 0) {
          lVar6 = (long)rightIndex;
          if (rightIndex == rightLength) {
            uVar7 = 2;
            break;
          }
          rightIndex = rightIndex + 1;
          UVar1 = local_40[lVar6];
          uVar5 = (uint)(ushort)UVar1;
          puVar8 = table_00;
          if (((ushort)UVar1 < 0x180) || (puVar8 = local_48, (UVar1 & 0xffc0U) == 0x2000)) {
            uVar10 = (uint32_t)puVar8[uVar5];
LAB_00234e76:
            uVar9 = uVar10;
            if (uVar10 < 0xc00) goto LAB_00234e9d;
          }
          else {
            uVar10 = 1;
            if (uVar5 == 0xffff) {
              uVar10 = 0xfca8;
            }
            uVar9 = 3;
            if (uVar5 != 0xfffe) goto LAB_00234e76;
LAB_00234e9d:
            uVar10 = nextPair(table_00,uVar5,uVar9,local_40,(uint8_t *)0x0,&rightIndex,&rightLength)
            ;
          }
          uVar10 = getQuaternaries(variableTop,uVar10);
          uVar7 = (ulong)uVar10;
        }
        if (uVar3 != (uint)uVar7) {
          uVar5 = uVar3 & 0xffff;
          uVar9 = (uint)uVar7 & 0xffff;
          if (uVar5 != uVar9) goto LAB_00234d49;
          if (uVar3 == 2) goto LAB_00234cfb;
          uVar3 = uVar3 >> 0x10;
          local_58 = uVar7 >> 0x10 & 0xffff;
          goto LAB_00234d8a;
        }
        local_58 = 0;
        bVar11 = uVar3 != 2;
        uVar3 = 0;
      } while (bVar11);
      goto LAB_00234d57;
    }
  }
LAB_00234cfb:
  local_58 = 0;
LAB_00234d57:
  return (int32_t)local_58;
LAB_00234d49:
  uVar3 = -(uint)(uVar5 < uVar9);
LAB_00234d4f:
  local_58 = (ulong)(uVar3 | 1);
  goto LAB_00234d57;
}

Assistant:

int32_t
CollationFastLatin::compareUTF16(const uint16_t *table, const uint16_t *primaries, int32_t options,
                                 const UChar *left, int32_t leftLength,
                                 const UChar *right, int32_t rightLength) {
    // This is a modified copy of CollationCompare::compareUpToQuaternary(),
    // optimized for common Latin text.
    // Keep them in sync!
    // Keep compareUTF16() and compareUTF8() in sync very closely!

    U_ASSERT((table[0] >> 8) == VERSION);
    table += (table[0] & 0xff);  // skip the header
    uint32_t variableTop = (uint32_t)options >> 16;  // see getOptions()
    options &= 0xffff;  // needed for CollationSettings::getStrength() to work

    // Check for supported characters, fetch mini CEs, and compare primaries.
    int32_t leftIndex = 0, rightIndex = 0;
    /**
     * Single mini CE or a pair.
     * The current mini CE is in the lower 16 bits, the next one is in the upper 16 bits.
     * If there is only one, then it is in the lower bits, and the upper bits are 0.
     */
    uint32_t leftPair = 0, rightPair = 0;
    for(;;) {
        // We fetch CEs until we get a non-ignorable primary or reach the end.
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            if(c <= LATIN_MAX) {
                leftPair = primaries[c];
                if(leftPair != 0) { break; }
                if(c <= 0x39 && c >= 0x30 && (options & CollationSettings::NUMERIC) != 0) {
                    return BAIL_OUT_RESULT;
                }
                leftPair = table[c];
            } else if(PUNCT_START <= c && c < PUNCT_LIMIT) {
                leftPair = table[c - PUNCT_START + LATIN_LIMIT];
            } else {
                leftPair = lookup(table, c);
            }
            if(leftPair >= MIN_SHORT) {
                leftPair &= SHORT_PRIMARY_MASK;
                break;
            } else if(leftPair > variableTop) {
                leftPair &= LONG_PRIMARY_MASK;
                break;
            } else {
                leftPair = nextPair(table, c, leftPair, left, NULL, leftIndex, leftLength);
                if(leftPair == BAIL_OUT) { return BAIL_OUT_RESULT; }
                leftPair = getPrimaries(variableTop, leftPair);
            }
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            if(c <= LATIN_MAX) {
                rightPair = primaries[c];
                if(rightPair != 0) { break; }
                if(c <= 0x39 && c >= 0x30 && (options & CollationSettings::NUMERIC) != 0) {
                    return BAIL_OUT_RESULT;
                }
                rightPair = table[c];
            } else if(PUNCT_START <= c && c < PUNCT_LIMIT) {
                rightPair = table[c - PUNCT_START + LATIN_LIMIT];
            } else {
                rightPair = lookup(table, c);
            }
            if(rightPair >= MIN_SHORT) {
                rightPair &= SHORT_PRIMARY_MASK;
                break;
            } else if(rightPair > variableTop) {
                rightPair &= LONG_PRIMARY_MASK;
                break;
            } else {
                rightPair = nextPair(table, c, rightPair, right, NULL, rightIndex, rightLength);
                if(rightPair == BAIL_OUT) { return BAIL_OUT_RESULT; }
                rightPair = getPrimaries(variableTop, rightPair);
            }
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftPrimary = leftPair & 0xffff;
        uint32_t rightPrimary = rightPair & 0xffff;
        if(leftPrimary != rightPrimary) {
            // Return the primary difference.
            return (leftPrimary < rightPrimary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    // In the following, we need to re-fetch each character because we did not buffer the CEs,
    // but we know that the string is well-formed and
    // only contains supported characters and mappings.

    // We might skip the secondary level but continue with the case level
    // which is turned on separately.
    if(CollationSettings::getStrength(options) >= UCOL_SECONDARY) {
        leftIndex = rightIndex = 0;
        leftPair = rightPair = 0;
        for(;;) {
            while(leftPair == 0) {
                if(leftIndex == leftLength) {
                    leftPair = EOS;
                    break;
                }
                UChar32 c = left[leftIndex++];
                if(c <= LATIN_MAX) {
                    leftPair = table[c];
                } else if(PUNCT_START <= c && c < PUNCT_LIMIT) {
                    leftPair = table[c - PUNCT_START + LATIN_LIMIT];
                } else {
                    leftPair = lookup(table, c);
                }
                if(leftPair >= MIN_SHORT) {
                    leftPair = getSecondariesFromOneShortCE(leftPair);
                    break;
                } else if(leftPair > variableTop) {
                    leftPair = COMMON_SEC_PLUS_OFFSET;
                    break;
                } else {
                    leftPair = nextPair(table, c, leftPair, left, NULL, leftIndex, leftLength);
                    leftPair = getSecondaries(variableTop, leftPair);
                }
            }

            while(rightPair == 0) {
                if(rightIndex == rightLength) {
                    rightPair = EOS;
                    break;
                }
                UChar32 c = right[rightIndex++];
                if(c <= LATIN_MAX) {
                    rightPair = table[c];
                } else if(PUNCT_START <= c && c < PUNCT_LIMIT) {
                    rightPair = table[c - PUNCT_START + LATIN_LIMIT];
                } else {
                    rightPair = lookup(table, c);
                }
                if(rightPair >= MIN_SHORT) {
                    rightPair = getSecondariesFromOneShortCE(rightPair);
                    break;
                } else if(rightPair > variableTop) {
                    rightPair = COMMON_SEC_PLUS_OFFSET;
                    break;
                } else {
                    rightPair = nextPair(table, c, rightPair, right, NULL, rightIndex, rightLength);
                    rightPair = getSecondaries(variableTop, rightPair);
                }
            }

            if(leftPair == rightPair) {
                if(leftPair == EOS) { break; }
                leftPair = rightPair = 0;
                continue;
            }
            uint32_t leftSecondary = leftPair & 0xffff;
            uint32_t rightSecondary = rightPair & 0xffff;
            if(leftSecondary != rightSecondary) {
                if((options & CollationSettings::BACKWARD_SECONDARY) != 0) {
                    // Full support for backwards secondary requires backwards contraction matching
                    // and moving backwards between merge separators.
                    return BAIL_OUT_RESULT;
                }
                return (leftSecondary < rightSecondary) ? UCOL_LESS : UCOL_GREATER;
            }
            if(leftPair == EOS) { break; }
            leftPair >>= 16;
            rightPair >>= 16;
        }
    }

    if((options & CollationSettings::CASE_LEVEL) != 0) {
        UBool strengthIsPrimary = CollationSettings::getStrength(options) == UCOL_PRIMARY;
        leftIndex = rightIndex = 0;
        leftPair = rightPair = 0;
        for(;;) {
            while(leftPair == 0) {
                if(leftIndex == leftLength) {
                    leftPair = EOS;
                    break;
                }
                UChar32 c = left[leftIndex++];
                leftPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
                if(leftPair < MIN_LONG) {
                    leftPair = nextPair(table, c, leftPair, left, NULL, leftIndex, leftLength);
                }
                leftPair = getCases(variableTop, strengthIsPrimary, leftPair);
            }

            while(rightPair == 0) {
                if(rightIndex == rightLength) {
                    rightPair = EOS;
                    break;
                }
                UChar32 c = right[rightIndex++];
                rightPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
                if(rightPair < MIN_LONG) {
                    rightPair = nextPair(table, c, rightPair, right, NULL, rightIndex, rightLength);
                }
                rightPair = getCases(variableTop, strengthIsPrimary, rightPair);
            }

            if(leftPair == rightPair) {
                if(leftPair == EOS) { break; }
                leftPair = rightPair = 0;
                continue;
            }
            uint32_t leftCase = leftPair & 0xffff;
            uint32_t rightCase = rightPair & 0xffff;
            if(leftCase != rightCase) {
                if((options & CollationSettings::UPPER_FIRST) == 0) {
                    return (leftCase < rightCase) ? UCOL_LESS : UCOL_GREATER;
                } else {
                    return (leftCase < rightCase) ? UCOL_GREATER : UCOL_LESS;
                }
            }
            if(leftPair == EOS) { break; }
            leftPair >>= 16;
            rightPair >>= 16;
        }
    }
    if(CollationSettings::getStrength(options) <= UCOL_SECONDARY) { return UCOL_EQUAL; }

    // Remove the case bits from the tertiary weight when caseLevel is on or caseFirst is off.
    UBool withCaseBits = CollationSettings::isTertiaryWithCaseBits(options);

    leftIndex = rightIndex = 0;
    leftPair = rightPair = 0;
    for(;;) {
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            leftPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
            if(leftPair < MIN_LONG) {
                leftPair = nextPair(table, c, leftPair, left, NULL, leftIndex, leftLength);
            }
            leftPair = getTertiaries(variableTop, withCaseBits, leftPair);
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            rightPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
            if(rightPair < MIN_LONG) {
                rightPair = nextPair(table, c, rightPair, right, NULL, rightIndex, rightLength);
            }
            rightPair = getTertiaries(variableTop, withCaseBits, rightPair);
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftTertiary = leftPair & 0xffff;
        uint32_t rightTertiary = rightPair & 0xffff;
        if(leftTertiary != rightTertiary) {
            if(CollationSettings::sortsTertiaryUpperCaseFirst(options)) {
                // Pass through EOS and MERGE_WEIGHT
                // and keep real tertiary weights larger than the MERGE_WEIGHT.
                // Tertiary CEs (secondary ignorables) are not supported in fast Latin.
                if(leftTertiary > MERGE_WEIGHT) {
                    leftTertiary ^= CASE_MASK;
                }
                if(rightTertiary > MERGE_WEIGHT) {
                    rightTertiary ^= CASE_MASK;
                }
            }
            return (leftTertiary < rightTertiary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    if(CollationSettings::getStrength(options) <= UCOL_TERTIARY) { return UCOL_EQUAL; }

    leftIndex = rightIndex = 0;
    leftPair = rightPair = 0;
    for(;;) {
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            leftPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
            if(leftPair < MIN_LONG) {
                leftPair = nextPair(table, c, leftPair, left, NULL, leftIndex, leftLength);
            }
            leftPair = getQuaternaries(variableTop, leftPair);
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            rightPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
            if(rightPair < MIN_LONG) {
                rightPair = nextPair(table, c, rightPair, right, NULL, rightIndex, rightLength);
            }
            rightPair = getQuaternaries(variableTop, rightPair);
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftQuaternary = leftPair & 0xffff;
        uint32_t rightQuaternary = rightPair & 0xffff;
        if(leftQuaternary != rightQuaternary) {
            return (leftQuaternary < rightQuaternary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    return UCOL_EQUAL;
}